

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

VarExtend * __thiscall kratos::Var::extend(Var *this,uint32_t width)

{
  unordered_map<unsigned_int,_std::shared_ptr<kratos::VarExtend>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::VarExtend>_>_>_>
  *this_00;
  iterator iVar1;
  __shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  VarExtend *local_38;
  shared_ptr<kratos::VarExtend> p;
  uint32_t width_local;
  
  this_00 = &this->extended_;
  p.super___shared_ptr<kratos::VarExtend,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       width;
  iVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<kratos::VarExtend>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::VarExtend>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&this_00->_M_h,
                 (key_type *)
                 ((long)&p.super___shared_ptr<kratos::VarExtend,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 4));
  if (iVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<kratos::VarExtend>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              (local_48,(__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                        &this->super_enable_shared_from_this<kratos::Var>);
    std::__shared_ptr<kratos::VarExtend,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<kratos::VarExtend>,std::shared_ptr<kratos::Var>,unsigned_int&>
              ((__shared_ptr<kratos::VarExtend,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (allocator<kratos::VarExtend> *)
               ((long)&p.super___shared_ptr<kratos::VarExtend,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 3),(shared_ptr<kratos::Var> *)local_48,
               (uint *)((long)&p.super___shared_ptr<kratos::VarExtend,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi + 4));
    if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
    }
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::shared_ptr<kratos::VarExtend>>,std::allocator<std::pair<unsigned_int_const,std::shared_ptr<kratos::VarExtend>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_int&,std::shared_ptr<kratos::VarExtend>&>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::shared_ptr<kratos::VarExtend>>,std::allocator<std::pair<unsigned_int_const,std::shared_ptr<kratos::VarExtend>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)this_00,
               (undefined1 *)
               ((long)&p.super___shared_ptr<kratos::VarExtend,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 4),&local_38);
    if (p.super___shared_ptr<kratos::VarExtend,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 p.super___shared_ptr<kratos::VarExtend,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  else {
    iVar1 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<kratos::VarExtend>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::VarExtend>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_00->_M_h,
                   (key_type *)
                   ((long)&p.super___shared_ptr<kratos::VarExtend,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 4));
    if (iVar1.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<kratos::VarExtend>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      std::__throw_out_of_range("_Map_base::at");
    }
    local_38 = *(VarExtend **)
                ((long)iVar1.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<kratos::VarExtend>_>,_false>
                       ._M_cur + 0x10);
  }
  return local_38;
}

Assistant:

VarExtend &Var::extend(uint32_t width) {
    if (extended_.find(width) != extended_.end()) {
        return *extended_.at(width);
    } else {
        auto p = std::make_shared<VarExtend>(shared_from_this(), width);
        extended_.emplace(width, p);
        return *p;
    }
}